

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Type * __thiscall slang::ast::PortSymbol::getType(PortSymbol *this)

{
  SyntaxNode *pSVar1;
  SourceLocation SVar2;
  bitmask<slang::ast::AssignFlags> assignFlags;
  bool bVar3;
  int iVar4;
  DeclaredType *this_00;
  Type *pTVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  undefined4 extraout_var;
  Diagnostic *pDVar8;
  Type *pTVar9;
  PortReferenceSyntax *prs;
  ArgumentDirection direction;
  ulong uVar10;
  LookupLocation LVar11;
  SourceRange sourceRange;
  Type *errorType;
  SymbolIndex local_58;
  bitmask<slang::ast::ASTFlags> local_50;
  Symbol *local_48;
  SourceLocation SStack_40;
  SourceLocation local_38;
  ValueSymbol *pVStack_30;
  PortBackrefVisitor visitor;
  
  if (this->type != (Type *)0x0) {
    return this->type;
  }
  pTVar9 = (Type *)(this->super_Symbol).parentScope;
  pSVar1 = (this->super_Symbol).originatingSyntax;
  if (this->internalSymbol == (Symbol *)0x0) {
    if (this->isNullPort == true) {
      this->type = (*(Compilation **)&pTVar9->super_Symbol)->voidType;
    }
    else {
      direction = this->direction;
      uVar10 = (ulong)direction;
      if (uVar10 < 3) {
        local_50.m_bits = *(underlying_type *)(&DAT_0044cdb8 + uVar10 * 8);
        direction = *(ArgumentDirection *)(&DAT_0044cdd0 + uVar10 * 4);
      }
      else {
        local_50.m_bits = 0x8000000020;
      }
      local_58 = 0xffffffff;
      local_48 = (Symbol *)0x0;
      SStack_40 = (SourceLocation)0x0;
      local_38 = (SourceLocation)0x0;
      pVStack_30 = (ValueSymbol *)0x0;
      errorType = pTVar9;
      iVar4 = Expression::bind((int)*(undefined8 *)(pSVar1 + 6),(sockaddr *)&errorType,0);
      pEVar6 = (Expression *)CONCAT44(extraout_var,iVar4);
      this->internalExpr = pEVar6;
      this->type = (pEVar6->type).ptr;
      bVar3 = Expression::bad(pEVar6);
      if (!bVar3) {
        Expression::checkConnectionDirection
                  (this->internalExpr,direction,(ASTContext *)&errorType,
                   (this->super_Symbol).location,
                   (bitmask<slang::ast::AssignFlags>)((this->direction == In) << 2));
        visitor.port = this;
        Expression::visit<slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
                  (this->internalExpr,&visitor);
      }
    }
  }
  else {
    this_00 = Symbol::getDeclaredType(this->internalSymbol);
    pTVar5 = DeclaredType::getType(this_00);
    this->type = pTVar5;
    local_50.m_bits = 0x8080100020;
    if (this->direction == Out) {
      local_50.m_bits = 0x8080000020;
    }
    LVar11 = LookupLocation::before(&this->super_Symbol);
    local_58 = LVar11.index;
    local_48 = (Symbol *)0x0;
    SStack_40 = (SourceLocation)0x0;
    local_38 = (SourceLocation)0x0;
    pVStack_30 = (ValueSymbol *)0x0;
    SVar2 = (this->super_Symbol).location;
    sourceRange.startLoc = (this->super_Symbol).name._M_len * 0x10000000 + (long)SVar2;
    errorType._0_1_ = SUB81(pTVar9,0);
    sourceRange.endLoc = (SourceLocation)0x0;
    bVar3 = errorType._0_1_;
    errorType = pTVar9;
    pEVar6 = ValueExpressionBase::fromSymbol
                       ((ValueExpressionBase *)&errorType,(ASTContext *)this->internalSymbol,
                        (Symbol *)0x0,(HierarchicalReference *)SVar2,sourceRange,false,bVar3);
    if ((pSVar1->kind == PortReference) &&
       ((ElementSelectSyntax *)pSVar1[1].previewNode != (ElementSelectSyntax *)0x0)) {
      pEVar7 = Expression::bindSelector
                         (pEVar6,(ElementSelectSyntax *)pSVar1[1].previewNode,
                          (ASTContext *)&errorType);
      this->internalExpr = pEVar7;
      this->type = (pEVar7->type).ptr;
    }
    ValueSymbol::addPortBackref((ValueSymbol *)this->internalSymbol,this);
    if ((this->direction & ~InOut) == In) {
      assignFlags.m_bits = '\x10';
      if (this->direction == In) {
        assignFlags.m_bits = '\x04';
      }
      if (this->internalExpr == (Expression *)0x0) {
        ASTContext::addDriver
                  ((ASTContext *)&errorType,(ValueSymbol *)this->internalSymbol,pEVar6,assignFlags);
      }
      else {
        Expression::requireLValue
                  (this->internalExpr,(ASTContext *)&errorType,(SourceLocation)0x0,assignFlags,
                   (Expression *)0x0);
      }
    }
  }
  bVar3 = Type::isValidForPort(this->type,&errorType);
  if (!bVar3) {
    SVar2 = (this->super_Symbol).location;
    if (errorType == this->type) {
      pDVar8 = Scope::addDiag((Scope *)pTVar9,(DiagCode)0x5e0006,SVar2);
      pTVar9 = this->type;
    }
    else {
      pDVar8 = Scope::addDiag((Scope *)pTVar9,(DiagCode)0x5d0006,SVar2);
      pDVar8 = ast::operator<<(pDVar8,this->type);
      pTVar9 = errorType;
    }
    ast::operator<<(pDVar8,pTVar9);
  }
  return this->type;
}

Assistant:

const Type& PortSymbol::getType() const {
    if (type)
        return *type;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    if (internalSymbol) {
        auto dt = internalSymbol->getDeclaredType();
        SLANG_ASSERT(dt);
        type = &dt->getType();

        bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::AllowInterconnect |
                                     ASTFlags::NoReference;
        if (direction != ArgumentDirection::Out)
            astFlags |= ASTFlags::LValue;

        ASTContext context(*scope, LookupLocation::before(*this), astFlags);

        auto& valExpr = ValueExpressionBase::fromSymbol(context, *internalSymbol, nullptr,
                                                        {location, location + name.length()});

        if (syntax->kind == SyntaxKind::PortReference) {
            auto& prs = syntax->as<PortReferenceSyntax>();
            if (auto select = prs.select) {
                internalExpr = &Expression::bindSelector(valExpr, *select, context);
                type = internalExpr->type;
            }
        }

        internalSymbol->as<ValueSymbol>().addPortBackref(*this);
        if (direction == ArgumentDirection::In || direction == ArgumentDirection::InOut) {
            // Ensure that this driver gets registered with the internal symbol.
            auto flags = direction == ArgumentDirection::In ? AssignFlags::InputPort
                                                            : AssignFlags::InOutPort;
            if (internalExpr) {
                internalExpr->requireLValue(context, {}, flags);
            }
            else {
                context.addDriver(internalSymbol->as<ValueSymbol>(), valExpr, flags);
            }
        }
    }
    else if (isNullPort) {
        type = &scope->getCompilation().getVoidType();
    }
    else {
        // We should have an explicit port connection expression here.
        auto& eaps = syntax->as<ExplicitAnsiPortSyntax>();
        SLANG_ASSERT(eaps.expr);

        // The direction of the connection is reversed, as data coming in to an input
        // port flows out to the internal symbol, and vice versa. Inout and ref
        // ports don't change.
        bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::NoReference;
        ArgumentDirection checkDir = direction;
        switch (direction) {
            case ArgumentDirection::In:
                checkDir = ArgumentDirection::Out;
                astFlags |= ASTFlags::LValue;
                break;
            case ArgumentDirection::Out:
                checkDir = ArgumentDirection::In;
                break;
            case ArgumentDirection::InOut:
                astFlags |= ASTFlags::LValue;
                break;
            case ArgumentDirection::Ref:
                break;
        }

        ASTContext context(*scope, LookupLocation::max, astFlags);
        internalExpr = &Expression::bind(*eaps.expr, context);
        type = internalExpr->type;

        if (!internalExpr->bad()) {
            Expression::checkConnectionDirection(*internalExpr, checkDir, context, location,
                                                 direction == ArgumentDirection::In
                                                     ? AssignFlags::InputPort
                                                     : AssignFlags::None);

            PortBackrefVisitor visitor(*this);
            internalExpr->visit(visitor);
        }
    }

    const Type* errorType;
    if (!type->isValidForPort(&errorType)) {
        if (errorType == type)
            scope->addDiag(diag::InvalidPortType, location) << *type;
        else
            scope->addDiag(diag::InvalidPortSubType, location) << *type << *errorType;
    }

    return *type;
}